

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O2

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<float,_float>,_Eigen::internal::redux_evaluator<Eigen::Block<Eigen::Matrix<float,_48,_24,_0,_48,_24>,_-1,_-1,_false>_>,_4,_0>
       ::run(redux_evaluator<Eigen::Block<Eigen::Matrix<float,_48,_24,_0,_48,_24>,__1,__1,_false>_>
             *mat,scalar_sum_op<float,_float> *func)

{
  float *pfVar1;
  ulong uVar2;
  long lVar3;
  PointerType pfVar4;
  long lVar5;
  Index i;
  PointerType pfVar6;
  ulong uVar7;
  Scalar SVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  uVar2 = (mat->m_xpr->
          super_BlockImpl<Eigen::Matrix<float,_48,_24,_0,_48,_24>,__1,__1,_false,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<float,_48,_24,_0,_48,_24>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,_48,_24,_0,_48,_24>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,_48,_24,_0,_48,_24>,__1,__1,_false>,_0>.
          m_rows.m_value;
  if ((0 < (long)uVar2) &&
     (lVar3 = (mat->m_xpr->
              super_BlockImpl<Eigen::Matrix<float,_48,_24,_0,_48,_24>,__1,__1,_false,_Eigen::Dense>)
              .super_BlockImpl_dense<Eigen::Matrix<float,_48,_24,_0,_48,_24>,__1,__1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<float,_48,_24,_0,_48,_24>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<float,_48,_24,_0,_48,_24>,__1,__1,_false>,_0>
              .m_cols.m_value, 0 < lVar3)) {
    if (3 < uVar2) {
      pfVar4 = (mat->m_evaluator).
               super_block_evaluator<Eigen::Matrix<float,_48,_24,_0,_48,_24>,__1,__1,_false,_true>.
               super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_48,_24,_0,_48,_24>,__1,__1,_false>,_Eigen::Matrix<float,__1,__1,_0,_48,_24>_>
               .m_data;
      fVar9 = *pfVar4;
      fVar10 = pfVar4[1];
      fVar11 = pfVar4[2];
      fVar12 = pfVar4[3];
      pfVar6 = pfVar4;
      for (lVar5 = 0; lVar5 != lVar3; lVar5 = lVar5 + 1) {
        for (uVar7 = (ulong)(lVar5 == 0) << 2; uVar7 < (uVar2 & 0x7ffffffffffffffc);
            uVar7 = uVar7 + 4) {
          pfVar1 = pfVar6 + uVar7;
          fVar9 = fVar9 + *pfVar1;
          fVar10 = fVar10 + pfVar1[1];
          fVar11 = fVar11 + pfVar1[2];
          fVar12 = fVar12 + pfVar1[3];
        }
        pfVar6 = pfVar6 + 0x30;
      }
      fVar9 = fVar12 + fVar10 + fVar11 + fVar9;
      for (lVar5 = 0; uVar7 = uVar2 & 0x7ffffffffffffffc, lVar5 != lVar3; lVar5 = lVar5 + 1) {
        for (; (long)uVar7 < (long)uVar2; uVar7 = uVar7 + 1) {
          fVar9 = fVar9 + pfVar4[uVar7];
        }
        pfVar4 = pfVar4 + 0x30;
      }
      return fVar9;
    }
    SVar8 = redux_impl<Eigen::internal::scalar_sum_op<float,_float>,_Eigen::internal::redux_evaluator<Eigen::Block<Eigen::Matrix<float,_48,_24,_0,_48,_24>,_-1,_-1,_false>_>,_0,_0>
            ::run(mat,func);
    return SVar8;
  }
  __assert_fail("mat.rows()>0 && mat.cols()>0 && \"you are using an empty matrix\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/luojunhui1[P]ImageOnC/include/Eigen/src/Core/Redux.h"
                ,0x114,
                "static Scalar Eigen::internal::redux_impl<Eigen::internal::scalar_sum_op<float>, Eigen::internal::redux_evaluator<Eigen::Block<Eigen::Matrix<float, 48, 24>>>>::run(const Derived &, const Func &) [Func = Eigen::internal::scalar_sum_op<float>, Derived = Eigen::internal::redux_evaluator<Eigen::Block<Eigen::Matrix<float, 48, 24>>>, Traversal = 4, Unrolling = 0]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC static Scalar run(const Derived &mat, const Func& func)
  {
    eigen_assert(mat.rows()>0 && mat.cols()>0 && "you are using an empty matrix");
    const Index innerSize = mat.innerSize();
    const Index outerSize = mat.outerSize();
    enum {
      packetSize = redux_traits<Func, Derived>::PacketSize
    };
    const Index packetedInnerSize = ((innerSize)/packetSize)*packetSize;
    Scalar res;
    if(packetedInnerSize)
    {
      PacketType packet_res = mat.template packet<Unaligned,PacketType>(0,0);
      for(Index j=0; j<outerSize; ++j)
        for(Index i=(j==0?packetSize:0); i<packetedInnerSize; i+=Index(packetSize))
          packet_res = func.packetOp(packet_res, mat.template packetByOuterInner<Unaligned,PacketType>(j,i));

      res = func.predux(packet_res);
      for(Index j=0; j<outerSize; ++j)
        for(Index i=packetedInnerSize; i<innerSize; ++i)
          res = func(res, mat.coeffByOuterInner(j,i));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = redux_impl<Func, Derived, DefaultTraversal, NoUnrolling>::run(mat, func);
    }

    return res;
  }